

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcTypeProduct::~IfcTypeProduct(IfcTypeProduct *this)

{
  ~IfcTypeProduct((IfcTypeProduct *)
                  ((long)&this[-1].super_IfcTypeObject.HasPropertySets.ptr.
                          super_vector<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
                          .
                          super__Vector_base<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>,_std::allocator<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcPropertySetDefinition>_>_>
                          ._M_impl.super__Vector_impl_data + 8));
  return;
}

Assistant:

IfcTypeProduct() : Object("IfcTypeProduct") {}